

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__fancy_alpha_weight_4ch(float *out_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  int iVar11;
  float *pfVar12;
  float *out;
  
  iVar11 = width_times_channels + 3;
  if (-1 < width_times_channels) {
    iVar11 = width_times_channels;
  }
  pfVar1 = out_buffer + (iVar11 >> 2) * 7;
  pfVar12 = pfVar1 + -(long)width_times_channels + 8;
  pfVar10 = pfVar1 + -(long)width_times_channels;
  while (pfVar12 <= pfVar1) {
    fVar2 = *pfVar10;
    fVar3 = pfVar10[1];
    fVar4 = pfVar10[2];
    fVar5 = pfVar10[3];
    fVar6 = pfVar10[4];
    fVar7 = pfVar10[5];
    fVar8 = pfVar10[6];
    fVar9 = pfVar10[7];
    *out_buffer = fVar2;
    out_buffer[1] = fVar3;
    out_buffer[2] = fVar4;
    out_buffer[3] = fVar5;
    out_buffer[4] = fVar5 * fVar2;
    out_buffer[5] = fVar5 * fVar3;
    out_buffer[6] = fVar5 * fVar4;
    out_buffer[7] = fVar5 * fVar5;
    out_buffer[7] = fVar6;
    out_buffer[8] = fVar7;
    out_buffer[9] = fVar8;
    out_buffer[10] = fVar9;
    out_buffer[0xb] = fVar9 * fVar6;
    out_buffer[0xc] = fVar9 * fVar7;
    out_buffer[0xd] = fVar9 * fVar8;
    out_buffer[0xe] = fVar9 * fVar9;
    out_buffer = out_buffer + 0xe;
    pfVar12 = pfVar10 + 0x10;
    pfVar10 = pfVar10 + 8;
  }
  if (pfVar10 < pfVar1) {
    fVar2 = *pfVar10;
    fVar3 = pfVar10[1];
    fVar4 = pfVar10[2];
    fVar5 = pfVar10[3];
    *out_buffer = fVar2;
    out_buffer[1] = fVar3;
    out_buffer[2] = fVar4;
    out_buffer[3] = fVar5;
    out_buffer[4] = fVar5 * fVar2;
    out_buffer[5] = fVar5 * fVar3;
    out_buffer[6] = fVar5 * fVar4;
    out_buffer[7] = fVar5 * fVar5;
  }
  return;
}

Assistant:

static void stbir__fancy_alpha_weight_4ch( float * out_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) out = out_buffer;
  float const * end_decode = out_buffer + ( width_times_channels / 4 ) * 7;  // decode buffer aligned to end of out_buffer
  float STBIR_STREAMOUT_PTR(*) decode = (float*)end_decode - width_times_channels;

  // fancy alpha is stored internally as R G B A Rpm Gpm Bpm

  #ifdef STBIR_SIMD

  #ifdef STBIR_SIMD8
  decode += 16;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdf8 d0,d1,a0,a1,p0,p1;
    STBIR_NO_UNROLL(decode);
    stbir__simdf8_load( d0, decode-16 );
    stbir__simdf8_load( d1, decode-16+8 );
    stbir__simdf8_0123to33333333( a0, d0 );
    stbir__simdf8_0123to33333333( a1, d1 );
    stbir__simdf8_mult( p0, a0, d0 );
    stbir__simdf8_mult( p1, a1, d1 );
    stbir__simdf8_bot4s( a0, d0, p0 );
    stbir__simdf8_bot4s( a1, d1, p1 );
    stbir__simdf8_top4s( d0, d0, p0 );
    stbir__simdf8_top4s( d1, d1, p1 );
    stbir__simdf8_store ( out, a0 );
    stbir__simdf8_store ( out+7, d0 );
    stbir__simdf8_store ( out+14, a1 );
    stbir__simdf8_store ( out+21, d1 );
    decode += 16;
    out += 28;
  }
  decode -= 16;
  #else
  decode += 8;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdf d0,a0,d1,a1,p0,p1;
    STBIR_NO_UNROLL(decode);
    stbir__simdf_load( d0, decode-8 );
    stbir__simdf_load( d1, decode-8+4 );
    stbir__simdf_0123to3333( a0, d0 );
    stbir__simdf_0123to3333( a1, d1 );
    stbir__simdf_mult( p0, a0, d0 );
    stbir__simdf_mult( p1, a1, d1 );
    stbir__simdf_store ( out, d0 );
    stbir__simdf_store ( out+4, p0 );
    stbir__simdf_store ( out+7, d1 );
    stbir__simdf_store ( out+7+4, p1 );
    decode += 8;
    out += 14;
  }
  decode -= 8;
  #endif

  // might be one last odd pixel
  #ifdef STBIR_SIMD8
  STBIR_NO_UNROLL_LOOP_START
  while ( decode < end_decode )
  #else
  if ( decode < end_decode )
  #endif
  {
    stbir__simdf d,a,p;
    STBIR_NO_UNROLL(decode);
    stbir__simdf_load( d, decode );
    stbir__simdf_0123to3333( a, d );
    stbir__simdf_mult( p, a, d );
    stbir__simdf_store ( out, d );
    stbir__simdf_store ( out+4, p );
    decode += 4;
    out += 7;
  }

  #else

  while( decode < end_decode )
  {
    float r = decode[0], g = decode[1], b = decode[2], alpha = decode[3];
    out[0] = r;
    out[1] = g;
    out[2] = b;
    out[3] = alpha;
    out[4] = r * alpha;
    out[5] = g * alpha;
    out[6] = b * alpha;
    out += 7;
    decode += 4;
  }

  #endif
}